

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd256.c
# Opt level: O2

int rmd256_done(hash_state *md,uchar *out)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (md == (hash_state *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd256.c",0x13a);
  }
  if (out == (uchar *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd256.c",0x13b);
  }
  uVar3 = (ulong)(md->rmd128).curlen;
  if (uVar3 < 0x40) {
    md->data = (void *)((long)md->data + uVar3 * 8);
    (md->rmd128).curlen = (md->rmd128).curlen + 1;
    md->dummy[uVar3 + 8] = -0x80;
    uVar1 = (md->rmd128).curlen;
    if (0x38 < uVar1) {
      while (uVar1 < 0x40) {
        (md->rmd128).curlen = uVar1 + 1;
        md->dummy[(ulong)uVar1 + 8] = '\0';
        uVar1 = (md->rmd128).curlen;
      }
      rmd256_compress(md,(md->chc).state);
      (md->rmd128).curlen = 0;
      uVar1 = 0;
    }
    while (uVar1 < 0x38) {
      (md->rmd128).curlen = uVar1 + 1;
      md->dummy[(ulong)uVar1 + 8] = '\0';
      uVar1 = (md->rmd128).curlen;
    }
    (md->whirlpool).state[7] = (md->chc).length;
    rmd256_compress(md,(md->chc).state);
    iVar2 = 0;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      *(undefined4 *)(out + lVar4 * 4) = *(undefined4 *)((long)md + lVar4 * 4 + 0x4c);
    }
  }
  else {
    iVar2 = 0x10;
  }
  return iVar2;
}

Assistant:

int rmd256_done(hash_state * md, unsigned char *out)
{
    int i;

    LTC_ARGCHK(md  != NULL);
    LTC_ARGCHK(out != NULL);

    if (md->rmd256.curlen >= sizeof(md->rmd256.buf)) {
       return CRYPT_INVALID_ARG;
    }


    /* increase the length of the message */
    md->rmd256.length += md->rmd256.curlen * 8;

    /* append the '1' bit */
    md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->rmd256.curlen > 56) {
        while (md->rmd256.curlen < 64) {
            md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
        }
        rmd256_compress(md, md->rmd256.buf);
        md->rmd256.curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->rmd256.curlen < 56) {
        md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64L(md->rmd256.length, md->rmd256.buf+56);
    rmd256_compress(md, md->rmd256.buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE32L(md->rmd256.state[i], out+(4*i));
    }
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
   return CRYPT_OK;
}